

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O2

double computeObjectiveValue(HighsLp *lp,HighsSolution *solution)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)lp->num_col_;
  if (lp->num_col_ < 1) {
    uVar1 = uVar2;
  }
  dVar3 = 0.0;
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    dVar3 = dVar3 + (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar2] *
                    (solution->col_value).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar2];
  }
  return dVar3 + lp->offset_;
}

Assistant:

double computeObjectiveValue(const HighsLp& lp, const HighsSolution& solution) {
  double objective_value = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
    objective_value += lp.col_cost_[iCol] * solution.col_value[iCol];
  objective_value += lp.offset_;
  return objective_value;
}